

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::changeEvent(QMdiSubWindow *this,QEvent *changeEvent)

{
  Representation RVar1;
  bool bVar2;
  Type TVar3;
  Int IVar4;
  QObject *pQVar5;
  ulong uVar6;
  QMdiSubWindowPrivate *pQVar7;
  QRect *pQVar8;
  QMdiSubWindowPrivate *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *d;
  QWindowStateChangeEvent *event;
  WindowStates newState;
  WindowStates oldState;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffff88;
  WindowState in_stack_ffffffffffffff8c;
  QFlagsStorage<Qt::WindowState> _t1;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QWidget *in_stack_ffffffffffffffa0;
  QMdiSubWindowPrivate *this_00;
  WindowState state;
  QMdiSubWindowPrivate *this_01;
  QFlagsStorageHelper<Qt::WindowState,_4> local_34;
  QFlagsStorageHelper<Qt::WindowState,_4> local_30;
  QFlagsStorageHelper<Qt::WindowState,_4> local_2c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_28;
  QFlagsStorageHelper<Qt::WindowState,_4> local_24;
  QFlagsStorageHelper<Qt::WindowState,_4> local_20;
  QFlagsStorageHelper<Qt::WindowState,_4> local_1c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_18;
  QFlagsStorage<Qt::WindowState> local_14;
  Int local_10;
  QFlagsStorageHelper<Qt::WindowState,_4> local_c;
  QMdiSubWindowPrivate *this_02;
  
  this_02 = *(QMdiSubWindowPrivate **)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar5 = QObject::parent((QObject *)0x6351af);
  if (pQVar5 == (QObject *)0x0) {
    QWidget::changeEvent
              (in_stack_ffffffffffffffa0,
               (QEvent *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98.i));
  }
  else {
    TVar3 = QEvent::type((QEvent *)in_RSI);
    if (TVar3 == WindowStateChange) {
      this_00 = in_RSI;
      uVar6 = QWindowStateChangeEvent::isOverride();
      if ((uVar6 & 1) == 0) {
        local_c.super_QFlagsStorage<Qt::WindowState>.i = (QFlagsStorage<Qt::WindowState>)0xaaaaaaaa;
        local_c.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)
             QWindowStateChangeEvent::oldState((QWindowStateChangeEvent *)in_RDI);
        local_10 = 0xaaaaaaaa;
        local_18.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)QWidget::windowState((QWidget *)in_RDI);
        local_14 = local_c.super_QFlagsStorage<Qt::WindowState>.i;
        local_10 = (Int)local_18.super_QFlagsStorage<Qt::WindowState>.i;
        bVar2 = ::operator==((QFlags<Qt::WindowState>)local_c.super_QFlagsStorage<Qt::WindowState>.i
                             ,(QFlags<Qt::WindowState>)
                              local_18.super_QFlagsStorage<Qt::WindowState>.i);
        if (bVar2) {
          QEvent::ignore((QEvent *)this_00);
        }
        else {
          pQVar7 = d_func((QMdiSubWindow *)0x635281);
          state = (WindowState)((ulong)this_00 >> 0x20);
          bVar2 = QWidget::isVisible((QWidget *)0x635290);
          if (!bVar2) {
            QMdiSubWindowPrivate::ensureWindowState(this_01,state);
            (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x68))(in_RDI,1);
          }
          bVar2 = QRect::isValid((QRect *)in_RDI);
          if (!bVar2) {
            pQVar8 = QWidget::geometry((QWidget *)in_RDI);
            RVar1.m_i = (pQVar8->y1).m_i;
            (pQVar7->oldGeometry).x1 = (Representation)(pQVar8->x1).m_i;
            (pQVar7->oldGeometry).y1 = (Representation)RVar1.m_i;
            RVar1.m_i = (pQVar8->y2).m_i;
            (pQVar7->oldGeometry).x2 = (Representation)(pQVar8->x2).m_i;
            (pQVar7->oldGeometry).y2 = (Representation)RVar1.m_i;
          }
          local_1c.super_QFlagsStorage<Qt::WindowState>.i =
               (QFlagsStorage<Qt::WindowState>)
               QFlags<Qt::WindowState>::operator&
                         ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff8c);
          IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
          in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
          if (IVar4 != 0) {
            local_20.super_QFlagsStorage<Qt::WindowState>.i =
                 (QFlagsStorage<Qt::WindowState>)
                 QFlags<Qt::WindowState>::operator&
                           ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff8c);
            IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
            in_stack_ffffffffffffff8c = CONCAT13(IVar4 != 0,(int3)in_stack_ffffffffffffff8c);
          }
          if ((char)(in_stack_ffffffffffffff8c >> 0x18) != '\0') {
            pQVar7->currentOperation = None;
          }
          local_24.super_QFlagsStorage<Qt::WindowState>.i =
               (QFlagsStorage<Qt::WindowState>)
               QFlags<Qt::WindowState>::operator&
                         ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff8c);
          bVar2 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_24);
          _t1.i = CONCAT13((char)(in_stack_ffffffffffffff8c >> 0x18),
                           (uint3)(ushort)in_stack_ffffffffffffff8c);
          if (bVar2) {
            local_28.super_QFlagsStorage<Qt::WindowState>.i =
                 (QFlagsStorage<Qt::WindowState>)
                 QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,_t1.i);
            IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
            _t1.i = CONCAT13((char)(_t1.i >> 0x18),CONCAT12(IVar4 != 0,(short)_t1.i));
          }
          if ((char)(_t1.i >> 0x10) == '\0') {
            local_2c.super_QFlagsStorage<Qt::WindowState>.i =
                 (QFlagsStorage<Qt::WindowState>)
                 QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,_t1.i);
            bVar2 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_2c);
            _t1.i = CONCAT22((short)(_t1.i >> 0x10),(ushort)(byte)_t1.i);
            if (bVar2) {
              local_30.super_QFlagsStorage<Qt::WindowState>.i =
                   (QFlagsStorage<Qt::WindowState>)
                   QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,_t1.i);
              IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
              _t1.i = CONCAT22((short)(_t1.i >> 0x10),CONCAT11(IVar4 != 0,(char)_t1.i));
            }
            if ((char)(_t1.i >> 8) == '\0') {
              Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
              QFlags<Qt::WindowState>::operator|((QFlags<Qt::WindowState> *)in_RDI,_t1.i);
              local_34.super_QFlagsStorage<Qt::WindowState>.i =
                   (QFlagsStorage<Qt::WindowState>)
                   QFlags<Qt::WindowState>::operator&
                             ((QFlags<Qt::WindowState> *)in_RDI,
                              (QFlags<Qt::WindowState>)in_stack_ffffffffffffff98.i);
              bVar2 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_34);
              if (bVar2) {
                QMdiSubWindowPrivate::setNormalMode(in_RSI);
              }
            }
            else {
              QMdiSubWindowPrivate::setMaximizeMode(this_02);
            }
          }
          else {
            QMdiSubWindowPrivate::setMinimizeMode(in_RDI);
          }
          if ((pQVar7->isActive & 1U) != 0) {
            QMdiSubWindowPrivate::ensureWindowState(this_01,state);
          }
          if ((pQVar7->activationEnabled & 1U) != 0) {
            QWidget::windowState((QWidget *)in_RDI);
            windowStateChanged((QMdiSubWindow *)0x6354d4,(WindowStates)_t1.i,
                               (WindowStates)in_stack_ffffffffffffff88.i);
          }
        }
      }
      else {
        QEvent::ignore((QEvent *)in_RSI);
      }
    }
    else {
      QWidget::changeEvent
                (in_stack_ffffffffffffffa0,
                 (QEvent *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98.i));
    }
  }
  if (*(QMdiSubWindowPrivate **)(in_FS_OFFSET + 0x28) != this_02) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::changeEvent(QEvent *changeEvent)
{
    if (!parent()) {
        QWidget::changeEvent(changeEvent);
        return;
    }

    if (changeEvent->type() != QEvent::WindowStateChange) {
        QWidget::changeEvent(changeEvent);
        return;
    }

    QWindowStateChangeEvent *event = static_cast<QWindowStateChangeEvent *>(changeEvent);
    if (event->isOverride()) {
        event->ignore();
        return;
    }

    Qt::WindowStates oldState = event->oldState();
    Qt::WindowStates newState = windowState();
    if (oldState == newState) {
        changeEvent->ignore();
        return;
    }

    // QWidget ensures that the widget is visible _after_ setWindowState(),
    // but we need to ensure that the widget is visible _before_
    // setWindowState() returns.
    Q_D(QMdiSubWindow);
    if (!isVisible()) {
        d->ensureWindowState(Qt::WindowNoState);
        setVisible(true);
    }

    if (!d->oldGeometry.isValid())
        d->oldGeometry = geometry();

    if ((oldState & Qt::WindowActive) && (newState & Qt::WindowActive))
        d->currentOperation = QMdiSubWindowPrivate::None;

    if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized))
        d->setMinimizeMode();
    else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized))
        d->setMaximizeMode();
    else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized | Qt::WindowFullScreen)))
        d->setNormalMode();

    if (d->isActive)
        d->ensureWindowState(Qt::WindowActive);
    if (d->activationEnabled)
        emit windowStateChanged(oldState, windowState());
}